

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O3

Result __thiscall
wabt::BinaryReaderLogging::OnTable
          (BinaryReaderLogging *this,Index index,Type elem_type,Limits *elem_limits)

{
  Stream *this_00;
  Enum EVar1;
  char buf [100];
  Type local_c0;
  string local_b8;
  char local_98 [104];
  
  local_c0 = elem_type;
  anon_unknown_25::SPrintLimits(local_98,(size_t)elem_limits,(Limits *)elem_type);
  WriteIndent(this);
  this_00 = this->stream_;
  Type::GetName_abi_cxx11_(&local_b8,&local_c0);
  Stream::Writef(this_00,"OnTable(index: %u, elem_type: %s, %s)\n",index,local_b8._M_dataplus._M_p,
                 local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x1e])
                    (this->reader_,index,local_c0,elem_limits);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnTable(Index index,
                                    Type elem_type,
                                    const Limits* elem_limits) {
  char buf[100];
  SPrintLimits(buf, sizeof(buf), elem_limits);
  LOGF("OnTable(index: %" PRIindex ", elem_type: %s, %s)\n", index,
       elem_type.GetName().c_str(), buf);
  return reader_->OnTable(index, elem_type, elem_limits);
}